

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O2

void __thiscall CHud::RenderVoting(CHud *this)

{
  long lVar1;
  ITextRender *pIVar2;
  CGameClient *pCVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  CUIRect Bars;
  CUIRect Base;
  CUIRect Rect;
  char aBufNo [64];
  char aBufYes [64];
  char aBuf [512];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = CVoting::IsVoting(((this->super_CComponent).m_pClient)->m_pVoting);
  if ((bVar4) && (((this->super_CComponent).m_pClient)->m_pClient->m_State != 4)) {
    Rect.x = -10.0;
    Rect.y = 58.0;
    Rect.w = 119.0;
    Rect.h = 46.0;
    aBuf[0] = '\0';
    aBuf[1] = '\0';
    aBuf[2] = '\0';
    aBuf[3] = '\0';
    aBuf[4] = '\0';
    aBuf[5] = '\0';
    aBuf[6] = '\0';
    aBuf[7] = '\0';
    aBuf[8] = '\0';
    aBuf[9] = '\0';
    aBuf[10] = '\0';
    aBuf[0xb] = '\0';
    aBuf[0xc] = -0x33;
    aBuf[0xd] = -0x34;
    aBuf[0xe] = -0x34;
    aBuf[0xf] = '>';
    CUIRect::Draw(&Rect,(vec4 *)aBuf,5.0,0xf);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    uVar5 = CVoting::SecondsLeft(((this->super_CComponent).m_pClient)->m_pVoting);
    pcVar7 = Localize("%ds left","");
    str_format(aBuf,0x200,pcVar7,(ulong)uVar5);
    if (RenderVoting()::s_TimerCursor == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderVoting()::s_TimerCursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderVoting::s_TimerCursor,6.0,105.0,60.0,0);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_TimerCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_TimerCursor);
      }
    }
    RenderVoting::s_TimerCursor.m_Align = 2;
    CTextCursor::Reset(&RenderVoting::s_TimerCursor,
                       (long)(int)uVar5 | (ulong)(uint)g_Localization.m_CurrentVersion << 0x20);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderVoting::s_TimerCursor,aBuf,0xffffffffffffffff);
    if (RenderVoting()::s_DescriptionCursor == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderVoting()::s_DescriptionCursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderVoting::s_DescriptionCursor,6.0,5.0,60.0,4);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_DescriptionCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_DescriptionCursor);
      }
    }
    RenderVoting::s_DescriptionCursor.m_MaxWidth = 100.0 - RenderVoting::s_TimerCursor.m_Width;
    RenderVoting::s_DescriptionCursor.m_MaxLines = 3;
    CTextCursor::Reset(&RenderVoting::s_DescriptionCursor,-1);
    pCVar3 = (this->super_CComponent).m_pClient;
    pIVar2 = pCVar3->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderVoting::s_DescriptionCursor,pCVar3->m_pVoting->m_aDescription,
               0xffffffffffffffff);
    if (RenderVoting()::s_ReasonCursor == '\0') {
      iVar6 = __cxa_guard_acquire(&RenderVoting()::s_ReasonCursor);
      if (iVar6 != 0) {
        CTextCursor::CTextCursor(&RenderVoting::s_ReasonCursor,6.0,5.0,79.0,4);
        __cxa_atexit(CTextCursor::~CTextCursor,&RenderVoting::s_ReasonCursor,&__dso_handle);
        __cxa_guard_release(&RenderVoting()::s_ReasonCursor);
      }
    }
    pcVar7 = Localize("Reason:","");
    str_format(aBuf,0x200,"%s %s",pcVar7,((this->super_CComponent).m_pClient)->m_pVoting->m_aReason)
    ;
    RenderVoting::s_ReasonCursor.m_MaxWidth = 100.0;
    CTextCursor::Reset(&RenderVoting::s_ReasonCursor,-1);
    pIVar2 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
              (pIVar2,&RenderVoting::s_ReasonCursor,aBuf,0xffffffffffffffff);
    Base.x = 5.0;
    Base.y = 88.0;
    Base.w = 100.0;
    Base.h = 4.0;
    Bars.w = 100.0;
    Bars.h = 4.0;
    Bars.x = 5.0;
    Bars.y = 88.0;
    CVoting::RenderBars(((this->super_CComponent).m_pClient)->m_pVoting,Bars);
    CBinds::GetKey(((this->super_CComponent).m_pClient)->m_pBinds,"vote yes",aBufYes,0x40);
    CBinds::GetKey(((this->super_CComponent).m_pClient)->m_pBinds,"vote no",aBufNo,0x40);
    pcVar7 = Localize("Vote yes","");
    str_format(aBuf,0x200,"%s - %s",aBufYes,pcVar7);
    Base.y = 93.0;
    CUI::DoLabel(&((this->super_CComponent).m_pClient)->m_UI,&Base,aBuf,6.0,0,-1.0,true);
    pcVar7 = Localize("Vote no","");
    str_format(aBuf,0x200,"%s - %s",pcVar7,aBufNo);
    CUI::DoLabel(&((this->super_CComponent).m_pClient)->m_UI,&Base,aBuf,6.0,2,-1.0,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CHud::RenderVoting()
{
	if(!m_pClient->m_pVoting->IsVoting() || Client()->State() == IClient::STATE_DEMOPLAYBACK)
		return;

	CUIRect Rect = {-10.0f, 58.0f, 119.0f, 46.0f};
	Rect.Draw(vec4(0.0f, 0.0f, 0.0f, 0.4f));

	TextRender()->TextColor(1,1,1,1);

	char aBuf[512];
	int SecondsLeft = m_pClient->m_pVoting->SecondsLeft();
	str_format(aBuf, sizeof(aBuf), Localize("%ds left"), SecondsLeft);
	static CTextCursor s_TimerCursor(6.0f, 105.0f, 60.0f);
	s_TimerCursor.m_Align = TEXTALIGN_RIGHT;
	s_TimerCursor.Reset(((int64)g_Localization.Version()) << 32 | SecondsLeft);
	TextRender()->TextOutlined(&s_TimerCursor, aBuf, -1);

	static CTextCursor s_DescriptionCursor(6.0f, 5.0f, 60.0f, TEXTFLAG_ELLIPSIS);
	s_DescriptionCursor.m_MaxWidth = 100.0f - s_TimerCursor.Width();
	s_DescriptionCursor.m_MaxLines = 3;
	s_DescriptionCursor.Reset();
	TextRender()->TextOutlined(&s_DescriptionCursor, m_pClient->m_pVoting->VoteDescription(), -1);

	// reason
	static CTextCursor s_ReasonCursor(6.0f, 5.0f, 79.0f, TEXTFLAG_ELLIPSIS);
	str_format(aBuf, sizeof(aBuf), "%s %s", Localize("Reason:"), m_pClient->m_pVoting->VoteReason());
	s_ReasonCursor.m_MaxWidth = 100.0f;
	s_ReasonCursor.Reset();
	TextRender()->TextOutlined(&s_ReasonCursor, aBuf, -1);

	CUIRect Base = {5, 88, 100, 4};
	m_pClient->m_pVoting->RenderBars(Base);

	char aBufYes[64], aBufNo[64];
	m_pClient->m_pBinds->GetKey("vote yes", aBufYes, sizeof(aBufYes));
	m_pClient->m_pBinds->GetKey("vote no", aBufNo, sizeof(aBufNo));
	str_format(aBuf, sizeof(aBuf), "%s - %s", aBufYes, Localize("Vote yes"));
	Base.y += Base.h+1;
	UI()->DoLabel(&Base, aBuf, 6.0f, TEXTALIGN_LEFT);

	str_format(aBuf, sizeof(aBuf), "%s - %s", Localize("Vote no"), aBufNo);
	UI()->DoLabel(&Base, aBuf, 6.0f, TEXTALIGN_RIGHT);
}